

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O0

char * __thiscall
cmGeneratorTarget::GetOutputTargetType(cmGeneratorTarget *this,ArtifactType artifact)

{
  bool bVar1;
  TargetType TVar2;
  ArtifactType artifact_local;
  cmGeneratorTarget *this_local;
  
  TVar2 = GetType(this);
  switch(TVar2) {
  case EXECUTABLE:
    if (artifact == RuntimeBinaryArtifact) {
      this_local = (cmGeneratorTarget *)anon_var_dwarf_2d71a4;
      return (char *)this_local;
    }
    if (artifact == ImportLibraryArtifact) {
      this_local = (cmGeneratorTarget *)0xa28dee;
      return (char *)this_local;
    }
    break;
  case STATIC_LIBRARY:
    this_local = (cmGeneratorTarget *)0xa28dee;
    return (char *)this_local;
  case SHARED_LIBRARY:
    bVar1 = IsDLLPlatform(this);
    if (!bVar1) {
      this_local = (cmGeneratorTarget *)0xa4a411;
      return (char *)this_local;
    }
    if (artifact == RuntimeBinaryArtifact) {
      this_local = (cmGeneratorTarget *)anon_var_dwarf_2d71a4;
      return (char *)this_local;
    }
    if (artifact == ImportLibraryArtifact) {
      this_local = (cmGeneratorTarget *)0xa28dee;
      return (char *)this_local;
    }
    break;
  case MODULE_LIBRARY:
    if (artifact == RuntimeBinaryArtifact) {
      this_local = (cmGeneratorTarget *)0xa4a411;
      return (char *)this_local;
    }
    if (artifact == ImportLibraryArtifact) {
      this_local = (cmGeneratorTarget *)0xa28dee;
      return (char *)this_local;
    }
  }
  this_local = (cmGeneratorTarget *)0xa6057c;
  return (char *)this_local;
}

Assistant:

const char* cmGeneratorTarget::GetOutputTargetType(
  cmStateEnums::ArtifactType artifact) const
{
  switch (this->GetType()) {
    case cmStateEnums::SHARED_LIBRARY:
      if (this->IsDLLPlatform()) {
        switch (artifact) {
          case cmStateEnums::RuntimeBinaryArtifact:
            // A DLL shared library is treated as a runtime target.
            return "RUNTIME";
          case cmStateEnums::ImportLibraryArtifact:
            // A DLL import library is treated as an archive target.
            return "ARCHIVE";
        }
      } else {
        // For non-DLL platforms shared libraries are treated as
        // library targets.
        return "LIBRARY";
      }
      break;
    case cmStateEnums::STATIC_LIBRARY:
      // Static libraries are always treated as archive targets.
      return "ARCHIVE";
    case cmStateEnums::MODULE_LIBRARY:
      switch (artifact) {
        case cmStateEnums::RuntimeBinaryArtifact:
          // Module import libraries are treated as archive targets.
          return "LIBRARY";
        case cmStateEnums::ImportLibraryArtifact:
          // Module libraries are always treated as library targets.
          return "ARCHIVE";
      }
      break;
    case cmStateEnums::EXECUTABLE:
      switch (artifact) {
        case cmStateEnums::RuntimeBinaryArtifact:
          // Executables are always treated as runtime targets.
          return "RUNTIME";
        case cmStateEnums::ImportLibraryArtifact:
          // Executable import libraries are treated as archive targets.
          return "ARCHIVE";
      }
      break;
    default:
      break;
  }
  return "";
}